

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O2

Result __thiscall tonk::SessionIncoming::resumeProcessing(SessionIncoming *this)

{
  ostringstream *this_00;
  ushort uVar1;
  Channel *pCVar2;
  uint uVar3;
  uchar *puVar4;
  SiameseResult SVar5;
  int iVar6;
  RefCounter *pRVar7;
  OutputWorker *this_01;
  Result *success;
  uint uVar8;
  ulong uVar9;
  SessionIncoming *in_RSI;
  LogStringBuffer *this_02;
  ulong uVar10;
  SiameseOriginalPacket packet;
  undefined1 local_1d8 [32];
  LogStringBuffer local_1b8;
  
  do {
    packet.PacketNum = in_RSI->FECNextExpectedPacketNum;
    SVar5 = siamese_decoder_get(in_RSI->FECDecoder,&packet);
    puVar4 = packet.Data;
    uVar3 = packet.DataBytes;
    if (SVar5 != Siamese_Success) {
      if (SVar5 == Siamese_NeedMoreData) {
        (this->Deps).ConnectionRef = (RefCounter *)0x0;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_1b8,"siamese_decoder_get failed",(allocator *)local_1d8);
        pRVar7 = (RefCounter *)operator_new(0x38);
        *(char **)pRVar7 = "SessionIncoming::resumeProcessing";
        std::__cxx11::string::string((string *)&pRVar7->ShutdownJson,(string *)&local_1b8);
        (pRVar7->RefCount).super___atomic_base<int>._M_i = 1;
        (this->Deps).ConnectionRef = pRVar7;
        *(long *)&(pRVar7->ShutdownLock).super___mutex_base._M_mutex = (long)(int)SVar5;
        std::__cxx11::string::~string((string *)&local_1b8);
        pCVar2 = (in_RSI->Deps).Logger;
        Result::ToJson_abi_cxx11_((string *)local_1d8,(Result *)this);
        if ((int)pCVar2->ChannelMinLevel < 5) {
          local_1b8.ChannelName = pCVar2->ChannelName;
          this_00 = &local_1b8.LogStream;
          local_1b8.LogLevel = Error;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<((ostream *)this_00,(string *)&pCVar2->Prefix);
          std::operator<<((ostream *)this_00,"siamese_decoder_get failed: ");
          std::operator<<((ostream *)this_00,(string *)local_1d8);
          this_01 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_01,&local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        }
        this_02 = (LogStringBuffer *)local_1d8;
LAB_00151dbe:
        std::__cxx11::string::~string((string *)this_02);
      }
      return (Result)(ErrorResult *)this;
    }
    in_RSI->FirstReliable = (uint8_t *)0x0;
    uVar9 = 0;
    in_RSI->FECNextExpectedPacketNum = in_RSI->FECNextExpectedPacketNum + 1 & 0x3fffff;
    uVar10 = (ulong)packet.DataBytes;
    while (uVar8 = (uint)uVar9, 1 < uVar3 - uVar8) {
      uVar1 = *(ushort *)(puVar4 + uVar9);
      iVar6 = uVar8 + 2;
      if (uVar3 - iVar6 < (uVar1 & 0x7ff)) {
        std::__cxx11::string::string
                  ((string *)&local_1b8,"Truncated message",(allocator *)local_1d8);
        pRVar7 = (RefCounter *)operator_new(0x38);
        *(char **)pRVar7 = "SessionIncoming::resumeProcessing";
        std::__cxx11::string::string((string *)&pRVar7->ShutdownJson,(string *)&local_1b8);
        goto LAB_00151da9;
      }
      uVar9 = (ulong)((uVar1 & 0x7ff) + iVar6);
      if (uVar1 >> 0xb != 0x1f && 0x27ff < uVar1) {
        handleReliableMessage
                  (this,(uint)in_RSI,(uint8_t *)(ulong)(uint)(uVar1 >> 0xb),iVar6 + (int)puVar4);
        if ((this->Deps).ConnectionRef != (RefCounter *)0x0) {
          return (Result)(ErrorResult *)this;
        }
        Result::~Result((Result *)this);
      }
    }
    if (uVar3 != uVar8) {
      std::__cxx11::string::string((string *)&local_1b8,"Invalid frame",(allocator *)local_1d8);
      pRVar7 = (RefCounter *)operator_new(0x38);
      *(char **)pRVar7 = "SessionIncoming::resumeProcessing";
      std::__cxx11::string::string((string *)&pRVar7->ShutdownJson,(string *)&local_1b8);
LAB_00151da9:
      (pRVar7->RefCount).super___atomic_base<int>._M_i = 0;
      this_02 = &local_1b8;
      (pRVar7->ShutdownLock).super___mutex_base._M_mutex.__align = 9;
      (this->Deps).ConnectionRef = pRVar7;
      goto LAB_00151dbe;
    }
    insertUncompressed(in_RSI,puVar4 + uVar10);
  } while( true );
}

Assistant:

Result SessionIncoming::resumeProcessing()
{
    // Run processing loop
    for (;;)
    {
        SiameseOriginalPacket packet;
        packet.PacketNum = FECNextExpectedPacketNum;

        // See if we already have the next one in sequence
        const int getResult = siamese_decoder_get(FECDecoder, &packet);

        if (getResult == Siamese_NeedMoreData) {
            break;
        }

        if (getResult != Siamese_Success)
        {
            const Result result = Result("SessionIncoming::resumeProcessing", "siamese_decoder_get failed", ErrorType::Siamese, getResult);
            Deps.Logger->Error("siamese_decoder_get failed: ", result.ToJson());
            TONK_DEBUG_BREAK();
            return result;
        }

        // Reset the compression state machine
        FirstReliable = nullptr;

        // Increment the next expected packet number
        FECNextExpectedPacketNum = SIAMESE_PACKET_NUM_INC(FECNextExpectedPacketNum);

        siamese::ReadByteStream frameReader(packet.Data, packet.DataBytes);

        // Process all messages contained in the datagram:
        while (frameReader.Remaining() >= protocol::kMessageFrameBytes)
        {
            // Read message frame header
            unsigned messageType = frameReader.Read16();
            const unsigned messageBytes = messageType & protocol::kMessageLengthMask;

            if (frameReader.Remaining() < messageBytes) {
                TONK_DEBUG_BREAK();
                return Result("SessionIncoming::resumeProcessing", "Truncated message", ErrorType::Tonk, Tonk_InvalidData);
            }

            messageType >>= protocol::kMessageLengthBits;
            const uint8_t* messageData = frameReader.Read(messageBytes);

            /*
                When processing data at this stage, unreliable and unordered data
                has already been delivered for sure, so we can skip it here.

                Unordered (reliable) data specifically might arrive five ways:

                (1) In sequence -> Delivered right away
                (2) Out of sequence original (not seen yet) -> Delivered right away
                (3) Out of sequence original (but seen already) -> Not delivered
                (4) Recovered by FEC (not seen yet) -> Delivered right away
                (5) After FEC recovery (already seen) -> Not delivered

                Cases (3) and (5) are what we are handling with this check.
            */
            if (messageType < protocol::MessageType_StartOfReliables ||
                messageType == protocol::MessageType_Unordered)
            {
                continue;
            }

            const Result result = handleReliableMessage(
                messageType,
                messageData,
                messageBytes);
            if (result.IsFail()) {
                return result;
            }
        }

        // If the message payload was not completely used:
        if (frameReader.Remaining() > 0)
        {
            TONK_DEBUG_BREAK(); // Invalid data
            return Result("SessionIncoming::resumeProcessing", "Invalid frame", ErrorType::Tonk, Tonk_InvalidData);
        }

        // Insert remaining uncompressed bytes
        insertUncompressed(frameReader.Peek());
    }

    return Result::Success();
}